

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

ModuleScope * __thiscall
capnp::compiler::Compiler::add(ModuleScope *__return_storage_ptr__,Compiler *this,Module *module)

{
  Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *this_00;
  Impl *this_01;
  CompiledModule *this_02;
  Node *this_03;
  uint64_t id;
  Node *local_20;
  Node *root;
  Module *module_local;
  Compiler *this_local;
  
  root = (Node *)module;
  module_local = (Module *)this;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffd0,&this->impl);
  this_00 = kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::operator->
                      ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
                       &stack0xffffffffffffffd0);
  this_01 = kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>::get(this_00);
  this_02 = Impl::addInternal(this_01,(Module *)root);
  this_03 = CompiledModule::getRootNode(this_02);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffd0);
  local_20 = this_03;
  id = Node::getId(this_03);
  ModuleScope::ModuleScope(__return_storage_ptr__,this,id,local_20);
  return __return_storage_ptr__;
}

Assistant:

Compiler::ModuleScope Compiler::add(Module& module) const {
  Node& root = impl.lockExclusive()->get()->addInternal(module).getRootNode();
  return ModuleScope(*this, root.getId(), root);
}